

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_help.c
# Opt level: O2

void cfg_help_bitmap256(autobuf *out,_Bool preamble)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,preamble) != 0) {
    abuf_puts(out,"    Parameter is a list of bit-numbers to define a bit-array.");
  }
  abuf_puts(out,
            "        Each of the bit-numbers must be between 0 and 255\n        In addition to this there are two keywords to configure the bit-array:\n        - \'all\' to set all bits in the bit-array\n        - \'none\' to reset all bits in the bit-array\n"
           );
  return;
}

Assistant:

void
cfg_help_bitmap256(struct autobuf *out, bool preamble) {
  if (preamble) {
    abuf_puts(out, CFG_HELP_INDENT_PREFIX "Parameter is a list of bit-numbers to define a bit-array.");
  }

  abuf_puts(out, CFG_HELP_INDENT_PREFIX
    "    Each of the bit-numbers must be between 0 and 255\n" CFG_HELP_INDENT_PREFIX
    "    In addition to this there are two keywords to configure the bit-array:\n" CFG_HELP_INDENT_PREFIX
    "    - '" BITMAP256_ALL "' to set all bits in the bit-array\n" CFG_HELP_INDENT_PREFIX "    - '" BITMAP256_NONE
    "' to reset all bits in the bit-array\n");
}